

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,DescriptorKeyReference *object)

{
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  (this->argument_)._M_dataplus._M_p = (pointer)&(this->argument_).field_2;
  (this->argument_)._M_string_length = 0;
  (this->argument_).field_2._M_local_buf[0] = '\0';
  this->key_type_ = object->key_type_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&object->schnorr_pubkey_);
  ExtPrivkey::operator=(&this->extprivkey_,&object->extprivkey_);
  ExtPubkey::operator=(&this->extpubkey_,&object->extpubkey_);
  KeyData::operator=(&this->key_data_,&object->key_data_);
  ::std::__cxx11::string::_M_assign((string *)&this->argument_);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const DescriptorKeyReference& object) {
  key_type_ = object.key_type_;
  pubkey_ = object.pubkey_;
  schnorr_pubkey_ = object.schnorr_pubkey_;
  extprivkey_ = object.extprivkey_;
  extpubkey_ = object.extpubkey_;
  key_data_ = object.key_data_;
  argument_ = object.argument_;
}